

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flops.cc
# Opt level: O0

float __thiscall benchmark_6::run_kernel(benchmark_6 *this,size_t iterations)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  long in_RSI;
  long in_RDI;
  uint uVar10;
  float fVar11;
  undefined1 in_ZMM0 [64];
  __m256 r5;
  __m256 r4;
  __m256 r3;
  __m256 r2;
  __m256 r1;
  __m256 r0;
  undefined8 local_640;
  undefined8 uStackY_638;
  undefined8 uStackY_630;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined8 local_568;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  
  uVar1 = rdtsc();
  uVar7 = (uint)((ulong)uVar1 >> 0x20);
  uVar6 = CONCAT44((int)((ulong)in_RDI >> 0x20),(int)uVar1) | (ulong)uVar7 << 0x20;
  auVar3 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,uVar6);
  uVar10 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar10),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar10),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar10),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar10),0x30);
  local_5a0._16_16_ = auVar2;
  local_5a0._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar8 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar6 = CONCAT44((int)(uVar6 >> 0x20),(int)uVar1) | CONCAT44(uVar7,uVar8) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar6);
  uVar7 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x30);
  local_5c0._16_16_ = auVar2;
  local_5c0._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar9 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar6 = CONCAT44((int)(uVar6 >> 0x20),(int)uVar1) | CONCAT44(uVar8,uVar9) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar6);
  uVar7 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x30);
  local_5e0._16_16_ = auVar2;
  local_5e0._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar8 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar6 = CONCAT44((int)(uVar6 >> 0x20),(int)uVar1) | CONCAT44(uVar9,uVar8) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar6);
  uVar7 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x30);
  local_600._16_16_ = auVar2;
  local_600._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar9 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar6 = CONCAT44((int)(uVar6 >> 0x20),(int)uVar1) | CONCAT44(uVar8,uVar9) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar6);
  uVar7 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x30);
  uVar12 = auVar3._0_8_;
  uVar13 = auVar3._8_8_;
  uVar14 = auVar2._0_8_;
  uStack_608 = auVar2._8_8_;
  uVar1 = rdtsc();
  auVar3 = vcvtusi2ss_avx512f(auVar3,CONCAT44((int)(uVar6 >> 0x20),(int)uVar1) |
                                     CONCAT44(uVar9,(int)((ulong)uVar1 >> 0x20)) << 0x20);
  uVar7 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x30);
  local_400 = auVar2._0_8_;
  uStack_3f8 = auVar2._8_8_;
  uStack_3f0 = auVar3._0_8_;
  uStack_3e8 = auVar3._8_8_;
  local_640 = local_400;
  uStackY_638 = uStack_3f8;
  uStackY_630 = uStack_3f0;
  local_568 = in_RSI;
  do {
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_5a0);
    local_5a0 = ZEXT1632(auVar3);
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_5c0);
    local_5c0 = ZEXT1632(auVar3);
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_5e0);
    local_5e0 = ZEXT1632(auVar3);
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_600);
    local_600 = ZEXT1632(auVar3);
    auVar5._8_8_ = uVar13;
    auVar5._0_8_ = uVar12;
    auVar5._16_8_ = uVar14;
    auVar5._24_8_ = uStack_608;
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),auVar5);
    uVar12 = auVar3._0_8_;
    uVar13 = auVar3._8_8_;
    uVar14 = 0;
    uStack_608 = 0;
    auVar4._8_8_ = uStackY_638;
    auVar4._0_8_ = local_640;
    auVar4._16_8_ = uStackY_630;
    auVar4._24_8_ = uStack_3e8;
    auVar2 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),auVar4);
    local_640 = auVar2._0_8_;
    uStackY_638 = auVar2._8_8_;
    uStackY_630 = 0;
    uStack_3e8 = 0;
    local_568 = local_568 + -1;
  } while (local_568 != 0);
  fVar11 = __m256_reduce_add_ps((__m256)(ZEXT1632(auVar3) << 0x40));
  return fVar11;
}

Assistant:

float run_kernel(size_t iterations) const override
    {
            __m256 r0 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r1 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r2 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r3 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r4 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r5 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            do{
                r0 = _mm256_fmadd_ps(mul0, mul1, r0);
                r1 = _mm256_fmadd_ps(mul0, mul1, r1);
                r2 = _mm256_fmadd_ps(mul0, mul1, r2);
                r3 = _mm256_fmadd_ps(mul0, mul1, r3);
                r4 = _mm256_fmadd_ps(mul0, mul1, r4);
                r5 = _mm256_fmadd_ps(mul0, mul1, r5);

            }while (--iterations);

            r0 = _mm256_add_ps(r0, r3);
            r1 = _mm256_add_ps(r1, r4);
            r2 = _mm256_add_ps(r3, r5);

            r0 = _mm256_add_ps(r0, r1);
            r0 = _mm256_add_ps(r0, r2);

            return __m256_reduce_add_ps(r0);
    }